

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  list<Task_*,_std::allocator<Task_*>_> *plVar1;
  curl_off_t size;
  string *download_address;
  _List_node_base *p_Var2;
  argument args;
  download_status local_f8;
  
  curl_global_init(3);
  std::queue<Task*,std::deque<Task*,std::allocator<Task*>>>::
  queue<std::deque<Task*,std::allocator<Task*>>,void>(&local_f8.taskMessageQueue);
  plVar1 = &local_f8.globalTaskList;
  local_f8.globalProxyList.super__List_base<proxy,_std::allocator<proxy>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_f8.globalProxyList;
  local_f8.globalTaskList.super__List_base<Task_*,_std::allocator<Task_*>_>._M_impl._M_node._M_size
       = 0;
  local_f8.globalProxyList.super__List_base<proxy,_std::allocator<proxy>_>._M_impl._M_node._M_size =
       0;
  local_f8.globalTaskList.super__List_base<Task_*,_std::allocator<Task_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)plVar1;
  local_f8.globalTaskList.super__List_base<Task_*,_std::allocator<Task_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)plVar1;
  local_f8.globalProxyList.super__List_base<proxy,_std::allocator<proxy>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       local_f8.globalProxyList.super__List_base<proxy,_std::allocator<proxy>_>._M_impl._M_node.
       super__List_node_base._M_next;
  std::queue<proxy,std::deque<proxy,std::allocator<proxy>>>::
  queue<std::deque<proxy,std::allocator<proxy>>,void>(&local_f8.pending_proxy_servers);
  parser(&args,argc,argv);
  initialize_proxy_list(args.proxy_list,args.proxy_count,&local_f8);
  download_address = &args.download_address;
  size = get_file_size(download_address,
                       (string *)
                       (local_f8.globalProxyList.super__List_base<proxy,_std::allocator<proxy>_>.
                        _M_impl._M_node.super__List_node_base._M_next + 1));
  create_file(args.file_name._M_dataplus._M_p,size);
  initialize_task_list(&args.file_name,download_address,size,&local_f8);
  start_progress_thread(size,&local_f8);
  message_loop(&args.file_name,download_address,size,&local_f8);
  p_Var2 = (_List_node_base *)plVar1;
  while (p_Var2 = (((_List_base<Task_*,_std::allocator<Task_*>_> *)&p_Var2->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next, p_Var2 != (_List_node_base *)plVar1) {
    Task::wait((Task *)p_Var2[1]._M_next,download_address);
  }
  curl_global_cleanup();
  argument::~argument(&args);
  download_status::~download_status(&local_f8);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    curl_global_init(CURL_GLOBAL_ALL);
    download_status Status{};// Status是全局的，包含当前下载的所有状态
    argument args = parser(argc, argv);
    initialize_proxy_list(args.proxy_list, args.proxy_count, &Status);
    curl_off_t file_length = get_file_size(args.download_address, Status.globalProxyList.front().address);
    create_file(args.file_name.c_str(), file_length);
    initialize_task_list(args.file_name, args.download_address, file_length, &Status);
    start_progress_thread(file_length, &Status);
    message_loop(args.file_name, args.download_address, file_length, &Status);
    for (Task *&task:Status.globalTaskList) {
        (*task).wait();
    }
    curl_global_cleanup();
}